

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>::
     Window<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,float>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  ulong *puVar1;
  FunctionData *pFVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  CursorType *data;
  idx_t n;
  reference q;
  pointer pWVar7;
  type this_00;
  WindowQuantileState<float> *this_01;
  TemplatedValidityData<unsigned_long> *pTVar8;
  float fVar9;
  QuantileIncluded<float> included;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  QuantileIncluded<float> local_48;
  unsigned_long local_38;
  
  data = QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                   ((QuantileState<float,_duckdb::QuantileStandardType> *)l_state,partition);
  local_48.fmask = *(ValidityMask **)(partition + 0x58);
  local_48.dmask = data;
  n = QuantileOperation::FrameSize<float>(&local_48,frames);
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  pFVar2 = (aggr_input_data->bind_data).ptr;
  lVar3 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  if (n == 0) {
    if (*(long *)(result + 0x28) == 0) {
      local_38 = *(unsigned_long *)(result + 0x40);
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,&local_38);
      p_Var6 = p_Stack_50;
      uVar5 = local_58;
      local_58 = 0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
      *(undefined8 *)(result + 0x30) = uVar5;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var6;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (result + 0x30));
      *(unsigned_long **)(result + 0x28) =
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    bVar4 = (byte)ridx & 0x3f;
    puVar1 = (ulong *)(*(long *)(result + 0x28) + (ridx >> 6) * 8);
    *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
  }
  else {
    q = vector<duckdb::QuantileValue,_true>::operator[]
                  ((vector<duckdb::QuantileValue,_true> *)(pFVar2 + 8),0);
    if ((g_state != (const_data_ptr_t)0x0) && (*(long *)(g_state + 0x18) != 0)) {
      pWVar7 = unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>,_true>
               ::operator->((unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>,_true>
                             *)(g_state + 0x18));
      if ((QuantileSortTree *)
          (pWVar7->qst).
          super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
          .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
        this_00 = unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>,_true>
                  ::operator*((unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>,_true>
                               *)(g_state + 0x18));
        fVar9 = WindowQuantileState<float>::WindowScalar<float,false>
                          (this_00,data,frames,n,result,q);
        *(float *)(lVar3 + ridx * 4) = fVar9;
        return;
      }
    }
    this_01 = QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                        ((QuantileState<float,_duckdb::QuantileStandardType> *)l_state);
    WindowQuantileState<float>::UpdateSkip(this_01,data,frames,&local_48);
    fVar9 = WindowQuantileState<float>::WindowScalar<float,false>(this_01,data,frames,n,result,q);
    *(float *)(lVar3 + ridx * 4) = fVar9;
    std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
              (&(this_01->prevs).
                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
               &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);

		if (!n) {
			rmask.Set(ridx, false);
			return;
		}

		const auto &quantile = bind_data.quantiles[0];
		if (gstate && gstate->HasTree()) {
			rdata[ridx] = gstate->GetWindowState().template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result,
			                                                                                    quantile);
		} else {
			auto &window_state = state.GetOrCreateWindowState();

			//	Update the skip list
			window_state.UpdateSkip(data, frames, included);

			// Find the position(s) needed
			rdata[ridx] = window_state.template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result, quantile);

			//	Save the previous state for next time
			window_state.prevs = frames;
		}
	}